

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall
olc::PixelGameEngine::DrawCircle
          (PixelGameEngine *this,int32_t x,int32_t y,int32_t radius,Pixel p,uint8_t mask)

{
  Sprite *pSVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  int iVar6;
  undefined4 in_register_00000034;
  int y0;
  ulong uVar7;
  bool bVar8;
  
  if ((-1 < radius) && (-radius <= y && -radius <= x)) {
    pSVar1 = this->pDrawTarget;
    if (pSVar1 == (Sprite *)0x0) {
      iVar2 = 0;
      if (radius < x) {
        return;
      }
    }
    else {
      if (radius < x - pSVar1->width) {
        return;
      }
      iVar2 = pSVar1->height;
    }
    if (y - iVar2 <= radius) {
      if (radius == 0) {
        (*this->_vptr_PixelGameEngine[5])
                  (this,CONCAT44(in_register_00000034,x),CONCAT44(in_register_00000014,y),
                   (ulong)(uint)p.field_0);
        return;
      }
      iVar6 = radius * -2 + 3;
      iVar3 = 0;
      uVar7 = (ulong)(uint)x;
      uVar5 = (ulong)(uint)y;
      iVar2 = 0;
      do {
        if ((mask & 1) != 0) {
          (*this->_vptr_PixelGameEngine[5])
                    (this,(ulong)(uint)(x + iVar2),(ulong)(uint)(y - radius),(ulong)(uint)p.field_0)
          ;
        }
        if ((mask & 4) != 0) {
          (*this->_vptr_PixelGameEngine[5])
                    (this,(ulong)(uint)(x + radius),(ulong)(uint)(y + iVar2),(ulong)(uint)p.field_0)
          ;
        }
        if ((mask & 0x10) != 0) {
          (*this->_vptr_PixelGameEngine[5])
                    (this,uVar7,(ulong)(uint)(y + radius),(ulong)(uint)p.field_0);
        }
        if ((mask & 0x40) != 0) {
          (*this->_vptr_PixelGameEngine[5])
                    (this,(ulong)(uint)(x - radius),uVar5,(ulong)(uint)p.field_0);
        }
        if ((iVar2 != 0) && (iVar2 != radius)) {
          if ((mask & 2) != 0) {
            (*this->_vptr_PixelGameEngine[5])
                      (this,(ulong)(uint)(x + radius),uVar5,(ulong)(uint)p.field_0);
          }
          if ((mask & 8) != 0) {
            (*this->_vptr_PixelGameEngine[5])
                      (this,(ulong)(uint)(x + iVar2),(ulong)(uint)(y + radius),
                       (ulong)(uint)p.field_0);
          }
          if ((mask & 0x20) != 0) {
            (*this->_vptr_PixelGameEngine[5])
                      (this,(ulong)(uint)(x - radius),(ulong)(uint)(y + iVar2),
                       (ulong)(uint)p.field_0);
          }
          if ((char)mask < '\0') {
            (*this->_vptr_PixelGameEngine[5])
                      (this,uVar7,(ulong)(uint)(y - radius),(ulong)(uint)p.field_0);
          }
        }
        bVar8 = -1 < iVar6;
        iVar4 = 0;
        if (bVar8) {
          iVar4 = radius;
        }
        radius = radius - (uint)bVar8;
        iVar6 = iVar6 + (uint)bVar8 * 4 + iVar4 * -4 + iVar3 + 6;
        iVar3 = iVar3 + 4;
        uVar5 = (ulong)((int)uVar5 - 1);
        uVar7 = (ulong)((int)uVar7 - 1);
        bVar8 = iVar2 < radius;
        iVar2 = iVar2 + 1;
      } while (bVar8);
    }
  }
  return;
}

Assistant:

void PixelGameEngine::DrawCircle(int32_t x, int32_t y, int32_t radius, Pixel p, uint8_t mask)
	{ // Thanks to IanM-Matrix1 #PR121
		if (radius < 0 || x < -radius || y < -radius || x - GetDrawTargetWidth() > radius || y - GetDrawTargetHeight() > radius)
			return;

		if (radius > 0)
		{
			int x0 = 0;
			int y0 = radius;
			int d = 3 - 2 * radius;

			while (y0 >= x0) // only formulate 1/8 of circle
			{
				// Draw even octants
				if (mask & 0x01) Draw(x + x0, y - y0, p);// Q6 - upper right right
				if (mask & 0x04) Draw(x + y0, y + x0, p);// Q4 - lower lower right
				if (mask & 0x10) Draw(x - x0, y + y0, p);// Q2 - lower left left
				if (mask & 0x40) Draw(x - y0, y - x0, p);// Q0 - upper upper left
				if (x0 != 0 && x0 != y0)
				{
					if (mask & 0x02) Draw(x + y0, y - x0, p);// Q7 - upper upper right
					if (mask & 0x08) Draw(x + x0, y + y0, p);// Q5 - lower right right
					if (mask & 0x20) Draw(x - y0, y + x0, p);// Q3 - lower lower left
					if (mask & 0x80) Draw(x - x0, y - y0, p);// Q1 - upper left left
				}

				if (d < 0)
					d += 4 * x0++ + 6;
				else
					d += 4 * (x0++ - y0--) + 10;
			}
		}
		else
			Draw(x, y, p);
	}